

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O3

char * google::protobuf::internal::TcParser::FastBmS1
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  byte *p;
  byte bVar1;
  int iVar2;
  uint uVar3;
  ushort *puVar4;
  char *pcVar5;
  ulong uVar6;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aVar7;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 this;
  ParseContext *ctx_00;
  ParseContext *extraout_RDX;
  size_t size_1;
  Arena *arena;
  ulong hasbits_00;
  uint *puVar8;
  size_t size;
  string_view data_00;
  string_view data_01;
  pair<const_char_*,_int> pVar9;
  
  if (data.field_0._0_1_ != '\0') {
    pcVar5 = MiniParse(msg,ptr,ctx,data,table,hasbits);
    return pcVar5;
  }
  this.data = (long)&msg->_vptr_MessageLite + ((ulong)data.field_0 >> 0x30);
  if ((this.data & 7) != 0) {
    AlignFail(this.data);
  }
  p = (byte *)(ptr + 1);
  aVar7.data = (ulong)data.field_0 >> 0x10 & 0xffff;
  arena = (Arena *)(msg->_internal_metadata_).ptr_;
  if (((ulong)arena & 1) != 0) {
    arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  hasbits_00 = hasbits | 1L << ((ulong)data.field_0 >> 0x10 & 0x3f);
  bVar1 = *p;
  pcVar5 = (char *)(ulong)bVar1;
  uVar3 = (uint)bVar1;
  if (arena == (Arena *)0x0) {
    if ((char)bVar1 < '\0') {
      pVar9 = ReadSizeFallback((char *)p,(uint)bVar1);
      ctx_00 = pVar9._8_8_;
      if (pVar9.first == (char *)0x0) goto LAB_0043c9ca;
      uVar3 = pVar9.second;
      pcVar5 = pVar9.first;
    }
    else {
      pcVar5 = ptr + 2;
    }
    iVar2 = EpsCopyInputStream::BytesAvailable(&ctx->super_EpsCopyInputStream,pcVar5);
    if ((int)uVar3 <= iVar2) {
      data_01._M_str = pcVar5;
      data_01._M_len = (long)(int)uVar3;
      MicroString::SetImpl((MicroString *)this,data_01,(Arena *)0x0,7);
      puVar4 = (ushort *)(pcVar5 + (int)uVar3);
      goto LAB_0043ca06;
    }
    arena = (Arena *)0x0;
  }
  else {
    if ((char)bVar1 < '\0') {
      pVar9 = ReadSizeFallback((char *)p,(uint)bVar1);
      ctx_00 = pVar9._8_8_;
      if (pVar9.first == (char *)0x0) goto LAB_0043c9ca;
      uVar3 = pVar9.second;
      pcVar5 = pVar9.first;
    }
    else {
      pcVar5 = ptr + 2;
    }
    iVar2 = EpsCopyInputStream::BytesAvailable(&ctx->super_EpsCopyInputStream,pcVar5);
    if ((int)uVar3 <= iVar2) {
      data_00._M_str = pcVar5;
      data_00._M_len = (long)(int)uVar3;
      MicroString::SetImpl((MicroString *)this,data_00,arena,7);
      puVar4 = (ushort *)(pcVar5 + (int)uVar3);
      goto LAB_0043ca06;
    }
  }
  puVar4 = (ushort *)
           EpsCopyInputStream::ReadMicroStringFallback
                     (&ctx->super_EpsCopyInputStream,pcVar5,uVar3,(MicroString *)this,arena);
  aVar7 = this;
  ctx_00 = extraout_RDX;
  if (puVar4 == (ushort *)0x0) {
LAB_0043c9ca:
    pcVar5 = Error(msg,pcVar5,ctx_00,(TcFieldData)aVar7,table,hasbits_00);
    return pcVar5;
  }
LAB_0043ca06:
  if ((ctx->super_EpsCopyInputStream).limit_end_ <= puVar4) {
    if ((ulong)table->has_bits_offset != 0) {
      puVar8 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
      if (((ulong)puVar8 & 3) != 0) {
        AlignFail(puVar8);
      }
      *puVar8 = *puVar8 | (uint)hasbits_00;
    }
    return (char *)puVar4;
  }
  uVar3 = (uint)table->fast_idx_mask & (uint)*puVar4;
  if ((uVar3 & 7) != 0) {
    protobuf_assumption_failed
              ("(idx & 7) == 0",
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
               ,0x452);
  }
  uVar6 = (ulong)(uVar3 & 0xfffffff8);
  pcVar5 = (char *)(**(code **)(&table[1].has_bits_offset + uVar6))
                             (msg,puVar4,ctx,
                              (ulong)*puVar4 ^ *(ulong *)(&table[1].fast_idx_mask + uVar6 * 2),table
                              ,hasbits_00);
  return pcVar5;
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastBmS1(PROTOBUF_TC_PARAM_DECL) {
  PROTOBUF_MUSTTAIL return SingularString<uint8_t, MicroString, kNoUtf8>(
      PROTOBUF_TC_PARAM_PASS);
}